

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_no_mac.c
# Opt level: O0

int32_t ll_packet_recv(uint16_t num_timeout_symbols,uint8_t *buf,uint16_t len,
                      uint8_t *bytes_received)

{
  uint8_t local_2a;
  undefined1 local_29;
  int32_t rw_response;
  uint8_t buff [2];
  uint8_t *bytes_received_local;
  uint16_t len_local;
  uint8_t *buf_local;
  uint16_t num_timeout_symbols_local;
  
  if (((buf == (uint8_t *)0x0) || (len == 0)) || (bytes_received == (uint8_t *)0x0)) {
    buf_local._4_4_ = -0x65;
  }
  else {
    local_2a = (uint8_t)(num_timeout_symbols >> 8);
    local_29 = (undefined1)num_timeout_symbols;
    _rw_response = bytes_received;
    buf_local._4_4_ = hal_read_write(OP_PKT_RECV,&local_2a,2,buf,len);
    if (buf_local._4_4_ < 0) {
      *_rw_response = '\0';
    }
    else {
      *_rw_response = (uint8_t)buf_local._4_4_;
      buf_local._4_4_ = 0;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int32_t ll_packet_recv(uint16_t num_timeout_symbols, uint8_t buf[], uint16_t len, uint8_t *bytes_received)
{
    uint8_t buff[2];
    int32_t rw_response;

    if (buf == NULL || len <= 0 || bytes_received == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    // Make the uint16_t value big-endian
    buff[0] = (num_timeout_symbols >> 8) & 0xFF;
    buff[1] = (num_timeout_symbols >> 0) & 0xFF;

    rw_response = hal_read_write(OP_PKT_RECV, buff, sizeof(num_timeout_symbols), buf, len);

    if (rw_response < 0)
    {
        *bytes_received = 0;
        return rw_response;
    }
    else
    {
        *bytes_received = (uint8_t) (rw_response & 0xFF);
        return(0);
    }
}